

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O2

uint __thiscall Kernel::Signature::getBoolSort(Signature *this)

{
  Symbol *this_00;
  uint uVar1;
  TermList resultSort;
  OperatorType *type;
  bool added;
  bool local_42;
  allocator<char> local_41;
  string local_40;
  
  local_42 = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"$o",&local_41);
  uVar1 = addTypeCon(this,&local_40,0,&local_42);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_42 == true) {
    this_00 = (this->_typeCons)._stack[uVar1];
    resultSort = AtomicSort::superSort();
    type = OperatorType::getConstantsType(resultSort,0);
    Symbol::setType(this_00,type);
  }
  return uVar1;
}

Assistant:

unsigned getBoolSort(){
    bool added = false;
    unsigned boolSort = addTypeCon("$o",0, added);
    if(added){
      getTypeCon(boolSort)->setType(OperatorType::getConstantsType(AtomicSort::superSort()));
    }
    return boolSort;
  }